

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendering.cpp
# Opt level: O2

bool __thiscall
duckdb::Linenoise::AddCompletionMarker
          (Linenoise *this,char *buf,idx_t len,string *result_buffer,
          vector<duckdb::highlightToken,_true> *tokens)

{
  byte *pbVar1;
  long lVar2;
  long lVar3;
  reference pvVar4;
  ulong uVar5;
  reference pvVar6;
  ulong uVar7;
  bool bVar8;
  idx_t cpos;
  size_t sVar9;
  value_type local_68;
  TabCompletion completion;
  
  if (enableCompletionRendering == '\x01') {
    if (999 < len) {
      return false;
    }
    if (this->continuation_markers == false) {
      return false;
    }
    if ((this->insert == true) && (2 < this->pos && this->pos == len)) {
      uVar5 = len;
      if ((tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (tokens->super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>).
          super__Vector_base<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pvVar4 = vector<duckdb::highlightToken,_true>::back(tokens);
        if (pvVar4->type == TOKEN_ERROR) {
          return false;
        }
        uVar5 = this->pos;
      }
      uVar7 = uVar5 - 3;
      while (uVar7 < uVar5) {
        pbVar1 = (byte *)(buf + uVar7);
        uVar7 = uVar7 + 1;
        if ((*pbVar1 != 0x5f) && (0x19 < (byte)((*pbVar1 & 0xdf) + 0xbf))) {
          return false;
        }
      }
      TabComplete(&completion,this);
      if ((completion.completions.
           super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
           super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>._M_impl.
           super__Vector_impl_data._M_start !=
           completion.completions.
           super_vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>.
           super__Vector_base<duckdb::Completion,_std::allocator<duckdb::Completion>_>._M_impl.
           super__Vector_impl_data._M_finish) &&
         (pvVar6 = vector<duckdb::Completion,_true>::get<true>(&completion.completions,0),
         len < (pvVar6->completion)._M_string_length)) {
        sVar9 = this->pos;
        do {
          if ((sVar9 == 0) ||
             ((buf[sVar9 - 1] != 0x5f && (0x19 < (byte)((buf[sVar9 - 1] & 0xdfU) + 0xbf))))) {
            local_68._0_8_ = (long)&local_68 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,buf,buf + len);
            ::std::__cxx11::string::operator=((string *)result_buffer,(string *)&local_68);
            ::std::__cxx11::string::~string((string *)&local_68);
            pvVar6 = vector<duckdb::Completion,_true>::get<true>(&completion.completions,0);
            ::std::__cxx11::string::substr((ulong)&local_68,(ulong)pvVar6);
            ::std::__cxx11::string::append((string *)result_buffer);
            ::std::__cxx11::string::~string((string *)&local_68);
            local_68.type = TOKEN_COMMENT;
            local_68.search_match = true;
            local_68.start = len;
            ::std::vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>::
            push_back(&tokens->
                       super_vector<duckdb::highlightToken,_std::allocator<duckdb::highlightToken>_>
                      ,&local_68);
            bVar8 = true;
            goto LAB_001f242b;
          }
          pvVar6 = vector<duckdb::Completion,_true>::get<true>(&completion.completions,0);
          lVar3 = sVar9 - 1;
          lVar2 = sVar9 - 1;
          sVar9 = sVar9 - 1;
        } while ((pvVar6->completion)._M_dataplus._M_p[lVar3] == buf[lVar2]);
      }
      bVar8 = false;
LAB_001f242b:
      ::std::vector<duckdb::Completion,_std::allocator<duckdb::Completion>_>::~vector
                ((vector<duckdb::Completion,_std::allocator<duckdb::Completion>_> *)&completion);
      return bVar8;
    }
  }
  return false;
}

Assistant:

bool Linenoise::AddCompletionMarker(const char *buf, idx_t len, string &result_buffer,
                                    vector<highlightToken> &tokens) const {
	if (!enableCompletionRendering) {
		return false;
	}
	if (!continuation_markers) {
		// don't render when pressing ctrl+c, only when editing
		return false;
	}
	static constexpr const idx_t MAX_COMPLETION_LENGTH = 1000;
	if (len >= MAX_COMPLETION_LENGTH) {
		return false;
	}
	if (!insert || pos != len) {
		// only show when inserting a character at the end
		return false;
	}
	if (pos < 3) {
		// we need at least 3 bytes
		return false;
	}
	if (!tokens.empty() && tokens.back().type == tokenType::TOKEN_ERROR) {
		// don't show auto-completion when we have errors
		return false;
	}
	// we ONLY show completion if we have typed at least three characters that are supported for completion
	// for now this is ONLY the characters a-z, A-Z and underscore (_)
	for (idx_t i = pos - 3; i < pos; i++) {
		if (!IsCompletionCharacter(buf[i])) {
			return false;
		}
	}
	auto completion = TabComplete();
	if (completion.completions.empty()) {
		// no completions found
		return false;
	}
	if (completion.completions[0].completion.size() <= len) {
		// completion is not long enough
		return false;
	}
	// we have stricter requirements for rendering completions - the completion must match exactly
	for (idx_t i = pos; i > 0; i--) {
		auto cpos = i - 1;
		if (!IsCompletionCharacter(buf[cpos])) {
			break;
		}
		if (completion.completions[0].completion[cpos] != buf[cpos]) {
			return false;
		}
	}
	// add the first completion found for rendering purposes
	result_buffer = string(buf, len);
	result_buffer += completion.completions[0].completion.substr(len);

	highlightToken completion_token;
	completion_token.start = len;
	completion_token.type = tokenType::TOKEN_COMMENT;
	completion_token.search_match = true;
	tokens.push_back(completion_token);
	return true;
}